

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O2

void total_errors(int *toterr,int *totwrn)

{
  HduName *pHVar1;
  HduName **ppHVar2;
  undefined8 in_RAX;
  long lVar3;
  int iwrn;
  int ierr;
  undefined8 local_28;
  
  *toterr = 0;
  *totwrn = 0;
  ppHVar2 = hduname;
  if (totalhdu == 0) {
    *toterr = 1;
  }
  else {
    for (lVar3 = 0; lVar3 < totalhdu; lVar3 = lVar3 + 1) {
      pHVar1 = ppHVar2[lVar3];
      *toterr = *toterr + pHVar1->errnum;
      *totwrn = *totwrn + pHVar1->wrnno;
    }
    local_28 = in_RAX;
    num_err_wrn((int *)((long)&local_28 + 4),(int *)&local_28);
    *toterr = *toterr + local_28._4_4_;
    *totwrn = *totwrn + (int)local_28;
  }
  return;
}

Assistant:

void total_errors (int *toterr, int * totwrn)  
{    
   int i = 0;
   int ierr, iwrn;
   *toterr = 0;
   *totwrn = 0;

   if (totalhdu == 0) { /* this means the file couldn't be opened */
       *toterr = 1;
       return;
   }

   for (i = 0; i < totalhdu; i++) { 
       *toterr += hduname[i]->errnum; 
       *totwrn += hduname[i]->wrnno;
   } 
   /*check the end of file errors */
   num_err_wrn(&ierr, &iwrn); 
   *toterr +=ierr; 
   *totwrn +=iwrn; 
   return;
}